

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

int cmcmd_cmake_ninja_dyndep(const_iterator argBeg,const_iterator argEnd)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  ulong uVar3;
  char *pcVar4;
  Value *pVVar5;
  reference this;
  pointer pcVar6;
  const_iterator cVar7;
  allocator<char> local_a79;
  string local_a78;
  unique_ptr<cmGlobalNinjaGenerator,_std::default_delete<cmGlobalNinjaGenerator>_> local_a58;
  unique_ptr<cmGlobalNinjaGenerator,_std::default_delete<cmGlobalNinjaGenerator>_> ggd;
  cmake cm;
  Value *tdi_linked_target_dir;
  undefined1 local_690 [8];
  const_iterator __end2;
  undefined1 local_670 [8];
  const_iterator __begin2;
  Value *__range2;
  Value *tdi_linked_target_dirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linked_target_dirs;
  string module_dir;
  string dir_top_src;
  string dir_top_bld;
  string dir_cur_src;
  string dir_cur_bld;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  undefined1 local_538 [8];
  Reader reader;
  ifstream tdif;
  Value *tdi;
  Value tdio;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  uint local_174;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150 [32];
  string local_130 [32];
  string local_110 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  string *arg;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_ddis;
  string arg_tdi;
  string arg_lang;
  string arg_dd;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_full;
  const_iterator argEnd_local;
  const_iterator argBeg_local;
  
  arg_full.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = argEnd._M_current;
  cmSystemTools::HandleResponseFile
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38,argBeg,argEnd);
  std::__cxx11::string::string((string *)(arg_lang.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(arg_tdi.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &arg_ddis.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38);
  arg = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_38);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&arg), bVar1) {
    local_e0 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    bVar1 = cmHasLiteralPrefix<std::__cxx11::string,7ul>(local_e0,(char (*) [7])0x8b1192);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)local_110,(ulong)local_e0);
      std::__cxx11::string::operator=
                ((string *)
                 &arg_ddis.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,local_110);
      std::__cxx11::string::~string(local_110);
    }
    else {
      bVar1 = cmHasLiteralPrefix<std::__cxx11::string,8ul>(local_e0,(char (*) [8])0x8b0a44);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)local_130,(ulong)local_e0);
        std::__cxx11::string::operator=((string *)(arg_tdi.field_2._M_local_buf + 8),local_130);
        std::__cxx11::string::~string(local_130);
      }
      else {
        bVar1 = cmHasLiteralPrefix<std::__cxx11::string,6ul>(local_e0,(char (*) [6])0x8b0a75);
        if (bVar1) {
          std::__cxx11::string::substr((ulong)local_150,(ulong)local_e0);
          std::__cxx11::string::operator=((string *)(arg_lang.field_2._M_local_buf + 8),local_150);
          std::__cxx11::string::~string(local_150);
        }
        else {
          bVar1 = cmHasLiteralPrefix<std::__cxx11::string,3ul>(local_e0,(char (*) [3])0x8edbaa);
          if ((bVar1) ||
             (bVar1 = cmHasLiteralSuffix<std::__cxx11::string,5ul>(local_e0,(char (*) [5])".ddi"),
             !bVar1)) {
            std::operator+(&local_170,"-E cmake_ninja_dyndep unknown argument: ",local_e0);
            cmSystemTools::Error(&local_170);
            std::__cxx11::string::~string((string *)&local_170);
            argBeg_local._M_current._4_4_ = 1;
            local_174 = 1;
            goto LAB_003a494c;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1,local_e0);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"-E cmake_ninja_dyndep requires value for --tdi=",&local_199);
    cmSystemTools::Error(&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
    argBeg_local._M_current._4_4_ = 1;
    local_174 = 1;
    goto LAB_003a494c;
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"-E cmake_ninja_dyndep requires value for --lang=",&local_1c1);
    cmSystemTools::Error(&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    argBeg_local._M_current._4_4_ = 1;
    local_174 = 1;
    goto LAB_003a494c;
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"-E cmake_ninja_dyndep requires value for --dd=",
               (allocator<char> *)((long)&tdio.limit_ + 7));
    cmSystemTools::Error(&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&tdio.limit_ + 7));
    argBeg_local._M_current._4_4_ = 1;
    local_174 = 1;
    goto LAB_003a494c;
  }
  Json::Value::Value((Value *)&tdi,nullValue);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(&reader.features_,pcVar4,_Var2);
  Json::Reader::Reader((Reader *)local_538);
  bVar1 = Json::Reader::parse((Reader *)local_538,(istream *)&reader.features_,(Value *)&tdi,false);
  if (!bVar1) {
    std::operator+(&local_578,"-E cmake_ninja_dyndep failed to parse ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &arg_ddis.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Json::Reader::getFormattedErrorMessages_abi_cxx11_
              ((string *)((long)&dir_cur_bld.field_2 + 8),(Reader *)local_538);
    std::operator+(&local_558,&local_578,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dir_cur_bld.field_2 + 8));
    cmSystemTools::Error(&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::string::~string((string *)(dir_cur_bld.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_578);
    argBeg_local._M_current._4_4_ = 1;
  }
  local_174 = (uint)!bVar1;
  Json::Reader::~Reader((Reader *)local_538);
  std::ifstream::~ifstream(&reader.features_);
  if (local_174 == 0) {
    pVVar5 = Json::Value::operator[]((Value *)&tdi,"dir-cur-bld");
    Json::Value::asString_abi_cxx11_((string *)((long)&dir_cur_src.field_2 + 8),pVVar5);
    pVVar5 = Json::Value::operator[]((Value *)&tdi,"dir-cur-src");
    Json::Value::asString_abi_cxx11_((string *)((long)&dir_top_bld.field_2 + 8),pVVar5);
    pVVar5 = Json::Value::operator[]((Value *)&tdi,"dir-top-bld");
    Json::Value::asString_abi_cxx11_((string *)((long)&dir_top_src.field_2 + 8),pVVar5);
    pVVar5 = Json::Value::operator[]((Value *)&tdi,"dir-top-src");
    Json::Value::asString_abi_cxx11_((string *)((long)&module_dir.field_2 + 8),pVVar5);
    pVVar5 = Json::Value::operator[]((Value *)&tdi,"module-dir");
    Json::Value::asString_abi_cxx11_
              ((string *)
               &linked_target_dirs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pVVar5);
    uVar3 = std::__cxx11::string::empty();
    if (((uVar3 & 1) == 0) &&
       (bVar1 = cmHasLiteralSuffix<std::__cxx11::string,2ul>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &linked_target_dirs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (char (*) [2])0x8fa875), !bVar1)) {
      std::__cxx11::string::operator+=
                ((string *)
                 &linked_target_dirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"/");
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&tdi_linked_target_dirs);
    pVVar5 = Json::Value::operator[]((Value *)&tdi,"linked-target-dirs");
    bVar1 = Json::Value::isArray(pVVar5);
    if (bVar1) {
      __begin2.super_ValueIteratorBase._8_8_ = pVVar5;
      cVar7 = Json::Value::begin(pVVar5);
      __end2.super_ValueIteratorBase._8_8_ = cVar7.super_ValueIteratorBase.current_._M_node;
      __begin2.super_ValueIteratorBase.current_._M_node._0_1_ =
           cVar7.super_ValueIteratorBase.isNull_;
      local_670 = (undefined1  [8])__end2.super_ValueIteratorBase._8_8_;
      cVar7 = Json::Value::end((Value *)__begin2.super_ValueIteratorBase._8_8_);
      local_690 = (undefined1  [8])cVar7.super_ValueIteratorBase.current_._M_node;
      __end2.super_ValueIteratorBase.current_._M_node._0_1_ = cVar7.super_ValueIteratorBase.isNull_;
      while (bVar1 = Json::ValueIteratorBase::operator!=
                               ((ValueIteratorBase *)local_670,(SelfType *)local_690), bVar1) {
        this = Json::ValueConstIterator::operator*((ValueConstIterator *)local_670);
        Json::Value::asString_abi_cxx11_((string *)&cm.MessageLogLevel,this);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&tdi_linked_target_dirs,(value_type *)&cm.MessageLogLevel);
        std::__cxx11::string::~string((string *)&cm.MessageLogLevel);
        Json::ValueConstIterator::operator++((ValueConstIterator *)local_670);
      }
    }
    cmake::cmake((cmake *)&ggd,RoleInternal,Unknown);
    cmake::SetHomeDirectory((cmake *)&ggd,(string *)((long)&module_dir.field_2 + 8));
    cmake::SetHomeOutputDirectory((cmake *)&ggd,(string *)((long)&dir_top_src.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a78,"Ninja",&local_a79);
    pcVar6 = (pointer)cmake::CreateGlobalGenerator((cmake *)&ggd,&local_a78);
    std::unique_ptr<cmGlobalNinjaGenerator,std::default_delete<cmGlobalNinjaGenerator>>::
    unique_ptr<std::default_delete<cmGlobalNinjaGenerator>,void>
              ((unique_ptr<cmGlobalNinjaGenerator,std::default_delete<cmGlobalNinjaGenerator>> *)
               &local_a58,pcVar6);
    std::__cxx11::string::~string((string *)&local_a78);
    std::allocator<char>::~allocator(&local_a79);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_a58);
    if (bVar1) {
      pcVar6 = std::unique_ptr<cmGlobalNinjaGenerator,_std::default_delete<cmGlobalNinjaGenerator>_>
               ::operator->(&local_a58);
      bVar1 = cmGlobalNinjaGenerator::WriteDyndepFile
                        (pcVar6,(string *)((long)&module_dir.field_2 + 8),
                         (string *)((long)&dir_top_src.field_2 + 8),
                         (string *)((long)&dir_top_bld.field_2 + 8),
                         (string *)((long)&dir_cur_src.field_2 + 8),
                         (string *)((long)&arg_lang.field_2 + 8),
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range1,
                         (string *)
                         &linked_target_dirs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&tdi_linked_target_dirs,(string *)((long)&arg_tdi.field_2 + 8));
      if (!bVar1) goto LAB_003a47d7;
      argBeg_local._M_current._4_4_ = 0;
    }
    else {
LAB_003a47d7:
      argBeg_local._M_current._4_4_ = 1;
    }
    local_174 = 1;
    std::unique_ptr<cmGlobalNinjaGenerator,_std::default_delete<cmGlobalNinjaGenerator>_>::
    ~unique_ptr(&local_a58);
    cmake::~cmake((cmake *)&ggd);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&tdi_linked_target_dirs);
    std::__cxx11::string::~string
              ((string *)
               &linked_target_dirs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)(module_dir.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(dir_top_src.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(dir_top_bld.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(dir_cur_src.field_2._M_local_buf + 8));
  }
  Json::Value::~Value((Value *)&tdi);
LAB_003a494c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  std::__cxx11::string::~string
            ((string *)
             &arg_ddis.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(arg_tdi.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(arg_lang.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return argBeg_local._M_current._4_4_;
}

Assistant:

int cmcmd_cmake_ninja_dyndep(std::vector<std::string>::const_iterator argBeg,
                             std::vector<std::string>::const_iterator argEnd)
{
  std::vector<std::string> arg_full =
    cmSystemTools::HandleResponseFile(argBeg, argEnd);

  std::string arg_dd;
  std::string arg_lang;
  std::string arg_tdi;
  std::vector<std::string> arg_ddis;
  for (std::string const& arg : arg_full) {
    if (cmHasLiteralPrefix(arg, "--tdi=")) {
      arg_tdi = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--lang=")) {
      arg_lang = arg.substr(7);
    } else if (cmHasLiteralPrefix(arg, "--dd=")) {
      arg_dd = arg.substr(5);
    } else if (!cmHasLiteralPrefix(arg, "--") &&
               cmHasLiteralSuffix(arg, ".ddi")) {
      arg_ddis.push_back(arg);
    } else {
      cmSystemTools::Error("-E cmake_ninja_dyndep unknown argument: " + arg);
      return 1;
    }
  }
  if (arg_tdi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --tdi=");
    return 1;
  }
  if (arg_lang.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --lang=");
    return 1;
  }
  if (arg_dd.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --dd=");
    return 1;
  }

  Json::Value tdio;
  Json::Value const& tdi = tdio;
  {
    cmsys::ifstream tdif(arg_tdi.c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (!reader.parse(tdif, tdio, false)) {
      cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse " + arg_tdi +
                           reader.getFormattedErrorMessages());
      return 1;
    }
  }

  std::string const dir_cur_bld = tdi["dir-cur-bld"].asString();
  std::string const dir_cur_src = tdi["dir-cur-src"].asString();
  std::string const dir_top_bld = tdi["dir-top-bld"].asString();
  std::string const dir_top_src = tdi["dir-top-src"].asString();
  std::string module_dir = tdi["module-dir"].asString();
  if (!module_dir.empty() && !cmHasLiteralSuffix(module_dir, "/")) {
    module_dir += "/";
  }
  std::vector<std::string> linked_target_dirs;
  Json::Value const& tdi_linked_target_dirs = tdi["linked-target-dirs"];
  if (tdi_linked_target_dirs.isArray()) {
    for (auto const& tdi_linked_target_dir : tdi_linked_target_dirs) {
      linked_target_dirs.push_back(tdi_linked_target_dir.asString());
    }
  }

  cmake cm(cmake::RoleInternal, cmState::Unknown);
  cm.SetHomeDirectory(dir_top_src);
  cm.SetHomeOutputDirectory(dir_top_bld);
  std::unique_ptr<cmGlobalNinjaGenerator> ggd(
    static_cast<cmGlobalNinjaGenerator*>(cm.CreateGlobalGenerator("Ninja")));
  if (!ggd ||
      !ggd->WriteDyndepFile(dir_top_src, dir_top_bld, dir_cur_src, dir_cur_bld,
                            arg_dd, arg_ddis, module_dir, linked_target_dirs,
                            arg_lang)) {
    return 1;
  }
  return 0;
}